

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::LocalVariableDeclarationSyntax::getChildPtr
          (LocalVariableDeclarationSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  PtrTokenOrSyntax *in_stack_ffffffffffffffb0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  case 2:
    not_null<slang::syntax::DataTypeSyntax_*>::get
              ((not_null<slang::syntax::DataTypeSyntax_*> *)(in_RDI + 0x60));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0x68),in_stack_ffffffffffffffa8);
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax LocalVariableDeclarationSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &var;
        case 2: return type.get();
        case 3: return &declarators;
        case 4: return &semi;
        default: return nullptr;
    }
}